

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O0

void new_pool_label(TCGContext_conflict9 *s,tcg_target_ulong d,int rtype,tcg_insn_unit *label,
                   intptr_t addend)

{
  TCGLabelPoolData *n_00;
  TCGLabelPoolData *n;
  intptr_t addend_local;
  tcg_insn_unit *label_local;
  int rtype_local;
  tcg_target_ulong d_local;
  TCGContext_conflict9 *s_local;
  
  n_00 = new_pool_alloc(s,1,rtype,label,addend);
  n_00[1].next = (TCGLabelPoolData *)d;
  new_pool_insert(s,n_00);
  return;
}

Assistant:

static inline void new_pool_label(TCGContext *s, tcg_target_ulong d, int rtype,
                                  tcg_insn_unit *label, intptr_t addend)
{
    TCGLabelPoolData *n = new_pool_alloc(s, 1, rtype, label, addend);
    n->data[0] = d;
    new_pool_insert(s, n);
}